

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O1

Vec_Wec_t * Abc_ExorcismNtk2Esop(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  int *piVar10;
  undefined8 *puVar11;
  long lVar12;
  char *pcVar13;
  int Entry;
  long lVar14;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  
  pVVar9 = pNtk->vCos;
  iVar2 = pNtk->vCis->nSize;
  if (pVVar9->nSize < 1) {
    uVar17 = 0;
  }
  else {
    lVar14 = 0;
    uVar17 = 0;
    do {
      pAVar15 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar9->pArray[lVar14] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar9->pArray[lVar14] + 0x20) * 8);
      if (pAVar15->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar15 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
      }
      uVar5 = 1;
      if ((*(uint *)&pAVar15->field_0x14 & 0xf) == 7) {
        iVar4 = Abc_NodeIsConst(pAVar15);
        if (iVar4 == 0) {
          uVar5 = Abc_SopGetCubeNum((char *)(pAVar15->field_5).pData);
        }
        else {
          iVar4 = Abc_NodeIsConst1(pAVar15);
          uVar5 = (uint)(iVar4 != 0);
        }
      }
      uVar17 = uVar17 + uVar5;
      lVar14 = lVar14 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      *(long *)((long)pVVar9->pArray[lVar14] + 0x40) = lVar14;
      lVar14 = lVar14 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < uVar17) {
    iVar4 = uVar17 + 1;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar7->pArray = pVVar8;
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    iVar4 = iVar2 + 2;
    lVar14 = 0;
    do {
      pAVar15 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar9->pArray[lVar14] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar9->pArray[lVar14] + 0x20) * 8);
      if (pAVar15->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar15 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
      }
      iVar6 = Abc_NodeIsConst(pAVar15);
      if ((iVar6 == 0) && (pcVar13 = (char *)(pAVar15->field_5).pData, *pcVar13 != '\0')) {
        lVar12 = (long)(pAVar15->vFanins).nSize + 3;
        uVar17 = pVVar7->nCap;
        uVar5 = pVVar7->nSize;
        uVar18 = uVar5;
        do {
          if (uVar18 == uVar17) {
            if ((int)uVar17 < 0x10) {
              if (pVVar7->pArray == (Vec_Int_t *)0x0) {
                pVVar8 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                pVVar8 = (Vec_Int_t *)realloc(pVVar7->pArray,0x100);
              }
              pVVar7->pArray = pVVar8;
              memset(pVVar8 + (int)uVar17,0,(long)(int)(0x10 - uVar17) << 4);
              uVar17 = 0x10;
            }
            else {
              uVar3 = uVar17 * 2;
              if (SBORROW4(uVar17,uVar3) != 0 < (int)uVar17) {
                if (pVVar7->pArray == (Vec_Int_t *)0x0) {
                  pVVar8 = (Vec_Int_t *)malloc((ulong)uVar3 << 4);
                }
                else {
                  pVVar8 = (Vec_Int_t *)realloc(pVVar7->pArray,(ulong)uVar3 << 4);
                }
                pVVar7->pArray = pVVar8;
                memset(pVVar8 + uVar17,0,(ulong)uVar17 * 0x10);
                uVar17 = uVar3;
              }
            }
          }
          uVar18 = uVar18 + 1;
          if ((int)uVar5 < 0) {
            pVVar7->nSize = uVar18;
            pVVar7->nCap = uVar17;
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar8 = pVVar7->pArray;
          p = pVVar8 + ((ulong)uVar18 - 1);
          if (p->nCap < iVar4) {
            if (pVVar8[(ulong)uVar18 - 1].pArray == (int *)0x0) {
              piVar10 = (int *)malloc((long)iVar4 << 2);
            }
            else {
              piVar10 = (int *)realloc(pVVar8[(ulong)uVar18 - 1].pArray,(long)iVar2 * 4 + 8);
            }
            pVVar8[(ulong)uVar18 - 1].pArray = piVar10;
            if (piVar10 == (int *)0x0) {
              pVVar7->nSize = uVar18;
              pVVar7->nCap = uVar17;
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p->nCap = iVar4;
          }
          if (0 < (pAVar15->vFanins).nSize) {
            iVar6 = 1;
            lVar16 = 0;
            do {
              puVar11 = (undefined8 *)
                        pAVar15->pNtk->vObjs->pArray[(pAVar15->vFanins).pArray[lVar16]];
              if (*(int *)*puVar11 == 1) {
                puVar11 = *(undefined8 **)
                           (*(long *)(*(long *)((int *)*puVar11 + 8) + 8) +
                           (long)*(int *)puVar11[4] * 8);
              }
              if (iVar2 <= *(int *)(puVar11 + 8)) {
                pVVar7->nSize = uVar18;
                pVVar7->nCap = uVar17;
                __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nIns",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                              ,0x3e6,"Vec_Wec_t *Abc_ExorcismNtk2Esop(Abc_Ntk_t *)");
              }
              if (pcVar13[lVar16] == '1') {
                Entry = (int)lVar16 * 2;
LAB_0034aefe:
                Vec_IntPush(p,Entry);
              }
              else {
                Entry = iVar6;
                if (pcVar13[lVar16] == '0') goto LAB_0034aefe;
              }
              lVar16 = lVar16 + 1;
              iVar6 = iVar6 + 2;
            } while (lVar16 < (pAVar15->vFanins).nSize);
          }
          Vec_IntPush(p,~(uint)lVar14);
          pcVar1 = pcVar13 + lVar12;
          pcVar13 = pcVar13 + lVar12;
        } while (*pcVar1 != '\0');
        pVVar7->nSize = uVar18;
        pVVar7->nCap = uVar17;
      }
      lVar14 = lVar14 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar14 < pVVar9->nSize);
  }
  return pVVar7;
}

Assistant:

Vec_Wec_t * Abc_ExorcismNtk2Esop( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vEsop = NULL;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCube;
    int nIns, nOuts, nProducts, nFanins, i, k;

    nIns = Abc_NtkCiNum( pNtk );
    nOuts = Abc_NtkCoNum( pNtk );

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    vEsop = Vec_WecAlloc( nProducts+1 );

    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( Abc_NodeIsConst(pDriver) ) continue;

        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Vec_Int_t *vCubeIn = Vec_WecPushLevel( vEsop );
            Vec_IntGrow( vCubeIn, nIns+2 );

            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nIns );
                if ( pCube[k] == '0' )
                {
                    Vec_IntPush( vCubeIn, 2*k + 1 );
                }
                else if ( pCube[k] == '1' )
                {
                    Vec_IntPush( vCubeIn, 2*k );
                }
            }
            Vec_IntPush( vCubeIn, -( i + 1 ) );
        }
    }

    return vEsop;
}